

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PPrototype * NewPrototype(TArray<PType_*,_PType_*> *rettypes,TArray<PType_*,_PType_*> *argtypes)

{
  PPrototype *this;
  size_t bucket;
  size_t local_20;
  
  this = (PPrototype *)
         FTypeTable::FindType
                   (&TypeTable,PPrototype::RegistrationInfo.MyClass,(intptr_t)argtypes,
                    (intptr_t)rettypes,&local_20);
  if (this == (PPrototype *)0x0) {
    this = (PPrototype *)
           M_Malloc_Dbg(0xa0,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
    PPrototype::PPrototype(this,rettypes,argtypes);
    FTypeTable::AddType(&TypeTable,(PType *)this,PPrototype::RegistrationInfo.MyClass,
                        (intptr_t)argtypes,(intptr_t)rettypes,local_20);
  }
  return this;
}

Assistant:

PPrototype *NewPrototype(const TArray<PType *> &rettypes, const TArray<PType *> &argtypes)
{
	size_t bucket;
	PType *proto = TypeTable.FindType(RUNTIME_CLASS(PPrototype), (intptr_t)&argtypes, (intptr_t)&rettypes, &bucket);
	if (proto == NULL)
	{
		proto = new PPrototype(rettypes, argtypes);
		TypeTable.AddType(proto, RUNTIME_CLASS(PPrototype), (intptr_t)&argtypes, (intptr_t)&rettypes, bucket);
	}
	return static_cast<PPrototype *>(proto);
}